

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

int secp256k1_jacobi32_maybe_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int alen;
  uint uVar20;
  int iVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  
  f.v[8] = (modinfo->modulus).v[8];
  f.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  f.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  f.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  f.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  g.v._8_8_ = *(undefined8 *)(x->v + 2);
  g.v._16_8_ = *(undefined8 *)(x->v + 4);
  g.v._24_8_ = *(undefined8 *)(x->v + 6);
  g.v[0] = (int32_t)*(undefined8 *)x->v;
  g.v[1] = (int32_t)((ulong)*(undefined8 *)x->v >> 0x20);
  g.v[8] = x->v[8];
  auVar23 = packssdw(*(undefined1 (*) [16])x->v,*(undefined1 (*) [16])(x->v + 4));
  if (((((((((auVar23 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar23 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar23 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar23 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar23[0xf]) &&
     (-1 < g.v[8])) {
    if ((g.v[7] == 0 &&
        ((g.v[6] == 0 && (g.v[5] == 0 && g.v[4] == 0)) &&
        ((g.v[3] == 0 && g.v[2] == 0) && (g.v[1] == 0 && g.v[0] == 0)))) && g.v[8] == 0) {
      pcVar15 = 
      "test condition failed: (g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4] | g.v[5] | g.v[6] | g.v[7] | g.v[8]) != 0"
      ;
      uVar7 = 0x2ac;
    }
    else {
      alen = 9;
      uVar22 = 0;
      iVar16 = -1;
      iVar1 = 0;
      while( true ) {
        iVar3 = 1;
        if (iVar1 == 0x19) {
          return 0;
        }
        uVar8 = f.v[1] << 0x1e | f.v[0];
        uVar17 = g.v[1] << 0x1e | g.v[0];
        iVar18 = 0;
        uVar11 = 0x1e;
        iVar14 = 0;
        uVar6 = uVar8;
        uVar19 = uVar17;
        iVar21 = iVar3;
        while( true ) {
          uVar2 = secp256k1_ctz32_var(-1 << ((byte)uVar11 & 0x1f) | uVar19);
          bVar5 = (byte)uVar2;
          uVar19 = uVar19 >> (bVar5 & 0x1f);
          iVar12 = iVar3 << (bVar5 & 0x1f);
          iVar14 = iVar14 << (bVar5 & 0x1f);
          iVar16 = iVar16 - uVar2;
          uVar22 = (uVar6 >> 2 ^ uVar6 >> 1) & uVar2 ^ uVar22;
          uVar11 = uVar11 - uVar2;
          if (uVar11 == 0) break;
          if ((uVar6 & 1) == 0) {
            pcVar15 = "test condition failed: (f & 1) == 1";
            uVar7 = 0x164;
            goto LAB_00133401;
          }
          if ((uVar19 & 1) == 0) {
            pcVar15 = "test condition failed: (g & 1) == 1";
            uVar7 = 0x165;
            goto LAB_00133401;
          }
          bVar5 = 0x1e - (char)uVar11;
          if (iVar14 * uVar17 + iVar12 * uVar8 != uVar6 << (bVar5 & 0x1f)) {
            pcVar15 = "test condition failed: (u * f0 + v * g0) == f << (30 - i)";
            uVar7 = 0x166;
            goto LAB_00133401;
          }
          if (iVar21 * uVar17 + iVar18 * uVar8 != uVar19 << (bVar5 & 0x1f)) {
            pcVar15 = "test condition failed: (q * f0 + r * g0) == g << (30 - i)";
            uVar7 = 0x167;
            goto LAB_00133401;
          }
          iVar3 = iVar12;
          uVar2 = uVar19;
          iVar9 = iVar21;
          if (iVar16 < 0) {
            iVar16 = -iVar16;
            uVar22 = uVar22 ^ (uVar19 & uVar6) >> 1;
            iVar3 = iVar18;
            uVar2 = uVar6;
            uVar6 = uVar19;
            iVar9 = iVar14;
            iVar18 = iVar12;
            iVar14 = iVar21;
          }
          uVar19 = iVar16 + 1U;
          if ((int)uVar11 <= (int)(iVar16 + 1U)) {
            uVar19 = uVar11;
          }
          if (0x1e < uVar19) {
            pcVar15 = "test condition failed: limit > 0 && limit <= 30";
            uVar7 = 0x178;
            goto LAB_00133401;
          }
          uVar13 = (uint)(0xff << (-(char)uVar19 & 0x1fU)) >> (-(char)uVar19 & 0x1fU);
          uVar20 = secp256k1_modinv32_inv256[uVar6 >> 1 & 0x7f] * uVar2 & uVar13;
          uVar19 = uVar20 * uVar6 + uVar2;
          iVar18 = uVar20 * iVar3 + iVar18;
          iVar21 = uVar20 * iVar14 + iVar9;
          if ((uVar19 & uVar13) != 0) {
            pcVar15 = "test condition failed: (g & m) == 0";
            uVar7 = 0x180;
            goto LAB_00133401;
          }
        }
        lVar4 = (long)iVar21 * (long)iVar12 - (long)iVar18 * (long)iVar14;
        t.u = iVar12;
        t.v = iVar14;
        t.q = iVar18;
        t.r = iVar21;
        if ((lVar4 != -0x40000000) && (lVar4 != 0x40000000)) break;
        iVar3 = secp256k1_modinv32_mul_cmp_30(&f,alen,&modinfo->modulus,0);
        if (iVar3 < 1) {
          pcVar15 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0";
          uVar7 = 0x2b3;
          goto LAB_00133401;
        }
        iVar3 = secp256k1_modinv32_mul_cmp_30(&f,alen,&modinfo->modulus,1);
        if (0 < iVar3) {
          pcVar15 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0"
          ;
          uVar7 = 0x2b4;
          goto LAB_00133401;
        }
        iVar3 = secp256k1_modinv32_mul_cmp_30(&g,alen,&modinfo->modulus,0);
        if (iVar3 < 1) {
          pcVar15 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0";
          uVar7 = 0x2b5;
          goto LAB_00133401;
        }
        iVar3 = secp256k1_modinv32_mul_cmp_30(&g,alen,&modinfo->modulus,1);
        if (-1 < iVar3) {
          pcVar15 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0";
          uVar7 = 0x2b6;
          goto LAB_00133401;
        }
        secp256k1_modinv32_update_fg_30_var(alen,&f,&g,&t);
        lVar4 = (long)alen;
        if (f.v[0] == 1) {
          uVar11 = 0;
          for (lVar10 = 1; lVar10 < lVar4; lVar10 = lVar10 + 1) {
            uVar11 = uVar11 | f.v[lVar10];
          }
          if (uVar11 == 0) {
            return 1 - (uVar22 * 2 & 2);
          }
        }
        if ((-1 < alen + -2 && f.v[lVar4 + -1] == 0) && g.v[lVar4 + -1] == 0) {
          alen = alen + -1;
        }
        iVar3 = secp256k1_modinv32_mul_cmp_30(&f,alen,&modinfo->modulus,0);
        if (iVar3 < 1) {
          pcVar15 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0";
          uVar7 = 0x2cd;
          goto LAB_00133401;
        }
        iVar3 = secp256k1_modinv32_mul_cmp_30(&f,alen,&modinfo->modulus,1);
        if (0 < iVar3) {
          pcVar15 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0"
          ;
          uVar7 = 0x2ce;
          goto LAB_00133401;
        }
        iVar3 = secp256k1_modinv32_mul_cmp_30(&g,alen,&modinfo->modulus,0);
        if (iVar3 < 1) {
          pcVar15 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0";
          uVar7 = 0x2cf;
          goto LAB_00133401;
        }
        iVar3 = secp256k1_modinv32_mul_cmp_30(&g,alen,&modinfo->modulus,1);
        if (-1 < iVar3) {
          pcVar15 = 
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0";
          uVar7 = 0x2d0;
          goto LAB_00133401;
        }
        iVar1 = iVar1 + 1;
      }
      pcVar15 = 
      "test condition failed: (int64_t)t->u * t->r - (int64_t)t->v * t->q == ((int64_t)1) << 30 || (int64_t)t->u * t->r - (int64_t)t->v * t->q == -(((int64_t)1) << 30)"
      ;
      uVar7 = 0x18c;
    }
  }
  else {
    pcVar15 = 
    "test condition failed: g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0 && g.v[5] >= 0 && g.v[6] >= 0 && g.v[7] >= 0 && g.v[8] >= 0"
    ;
    uVar7 = 0x2a7;
  }
LAB_00133401:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
          ,uVar7,pcVar15);
  abort();
}

Assistant:

static int secp256k1_jacobi32_maybe_var(const secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 */
    int32_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0 && g.v[5] >= 0 && g.v[6] >= 0 && g.v[7] >= 0 && g.v[8] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4] | g.v[5] | g.v[6] | g.v[7] | g.v[8]) != 0);

    for (count = 0; count < JACOBI32_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 30 posdivsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_posdivsteps_30_var(eta, f.v[0] | ((uint32_t)f.v[1] << 30), g.v[0] | ((uint32_t)g.v[1] << 30), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. If f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1500 iterations. Return 0, indicating unknown result. */
    return 0;
}